

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

Pattern * trieste::T(Pattern *__return_storage_ptr__,Token *type)

{
  initializer_list<trieste::Token> __l;
  initializer_list<trieste::Token> __l_00;
  allocator_type local_102;
  less<trieste::Token> local_101;
  Token local_100;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  vector<trieste::Token,_std::allocator<trieste::Token>_> types;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_b8;
  FastPattern local_88;
  
  local_f8._0_8_ = type->def;
  __l._M_len = 1;
  __l._M_array = (iterator)local_f8;
  std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&types,__l,(allocator_type *)&local_100);
  std::
  make_shared<trieste::detail::TokenMatch,std::vector<trieste::Token,std::allocator<trieste::Token>>&>
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_f8);
  local_f8._16_8_ = local_f8._0_8_;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
  local_f8._0_8_ = (TokenDef *)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_100 = (Token)type->def;
  __l_00._M_len = 1;
  __l_00._M_array = &local_100;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            (&local_b8,__l_00,&local_101,&local_102);
  detail::FastPattern::match_token(&local_88,&local_b8);
  detail::Pattern::Pattern(__return_storage_ptr__,(PatternPtr *)(local_f8 + 0x10),&local_88);
  detail::FastPattern::~FastPattern(&local_88);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
  std::_Vector_base<trieste::Token,_std::allocator<trieste::Token>_>::~_Vector_base
            (&types.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>);
  return __return_storage_ptr__;
}

Assistant:

inline detail::Pattern T(const Token& type)
  {
    std::vector<Token> types = {type};
    return detail::Pattern(
      std::make_shared<detail::TokenMatch>(types),
      detail::FastPattern::match_token({type}));
  }